

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

QPlatformMenu * __thiscall QMenuPrivate::createPlatformMenu(QMenuPrivate *this)

{
  QMenu *this_00;
  Data *pDVar1;
  bool bVar2;
  QPlatformMenu *pQVar3;
  
  this_00 = *(QMenu **)&(this->super_QWidgetPrivate).field_0x8;
  bVar2 = QWeakPointer<QObject>::isNull(&(this->platformMenu).wp);
  if (bVar2) {
    pQVar3 = (QPlatformMenu *)(**(code **)(*QGuiApplicationPrivate::platform_theme + 0x18))();
    QMenu::setPlatformMenu(this_00,pQVar3);
  }
  pDVar1 = (this->platformMenu).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar3 = (QPlatformMenu *)0x0;
  }
  else {
    pQVar3 = (QPlatformMenu *)(this->platformMenu).wp.value;
  }
  return pQVar3;
}

Assistant:

QPlatformMenu *QMenuPrivate::createPlatformMenu()
{
    Q_Q(QMenu);
    if (platformMenu.isNull())
        q->setPlatformMenu(QGuiApplicationPrivate::platformTheme()->createPlatformMenu());
    return platformMenu.data();
}